

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O2

char * ON_String::ToNumber(char *buffer,ON__UINT64 value_on_failure,ON__UINT64 *value)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (value == (ON__UINT64 *)0x0) {
    return (char *)0x0;
  }
  if (buffer != (char *)0x0) {
    if ((byte)(buffer[*buffer == '+'] - 0x30U) < 10) {
      pcVar1 = buffer + (*buffer == '+');
      uVar2 = (ulong)(byte)(buffer[*buffer == '+'] - 0x30U);
      do {
        pcVar1 = pcVar1 + 1;
        if (9 < (byte)(*pcVar1 - 0x30U)) goto LAB_005c7a05;
        uVar3 = uVar2 * 10 + (ulong)(byte)(*pcVar1 - 0x30U);
        bVar4 = uVar2 <= uVar3;
        uVar2 = uVar3;
      } while (bVar4);
    }
  }
  pcVar1 = (char *)0x0;
  uVar2 = value_on_failure;
LAB_005c7a05:
  *value = uVar2;
  return pcVar1;
}

Assistant:

const char* ON_String::ToNumber(
  const char* buffer,
  ON__UINT64 value_on_failure,
  ON__UINT64* value
  )
{
  if (nullptr == value)
    return nullptr;

  ON__UINT64 u = value_on_failure;
  const char* rc = nullptr;

  if (nullptr != buffer)
  {
    if ('+' == buffer[0])
      buffer++;
    if (buffer[0] >= '0' && buffer[0] <= '9')
    {
      ON__UINT64 r = (ON__UINT64)(*buffer++ - '0');
      for (const char* s = buffer;/*empty test*/; s++)
      {
        if (*s >= '0' && *s <= '9')
        {
          ON__UINT64 d = ON__UINT64(*s - '0');
          ON__UINT64 r1 = r * 10LLU + d;
          if (r1 < r)
          {
            // overflow
            break;
          }
          r = r1;
          continue;
        }
        u = r;
        rc = s;
        break;
      }
    }
  }

  *value = u;
  return rc;
}